

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

void __thiscall
tcu::anon_unknown_4::Test::check(Test *this,string *expr,double result,double reference)

{
  ostream *poVar1;
  TestError *this_00;
  ostringstream oss;
  char *local_1b0;
  ostringstream local_190 [376];
  
  if ((result == reference) && (!NAN(result) && !NAN(reference))) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,
                      (char *)(this->m_fmt).
                              super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                              .m_data.ptr,
                      *(long *)&(this->m_fmt).
                                super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>
                                .m_data.field_0x8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," returned ",10);
  poVar1 = std::ostream::_M_insert<double>(result);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", expected ",0xb);
  std::ostream::_M_insert<double>(reference);
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  TestError::TestError
            (this_00,local_1b0,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
             ,0x147);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

void Test::check (const string& expr, double result, double reference) const
{
	if (result != reference)
	{
		ostringstream oss;
		oss << expr << " returned " << result << ", expected " << reference;
		TCU_FAIL(oss.str().c_str());
	}
}